

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::PathTypeHandlerWithAttr::SetProperty
          (PathTypeHandlerWithAttr *this,DynamicObject *instance,PropertyId propertyId,Var value,
          PropertyOperationFlags flags,PropertyValueInfo *info)

{
  ObjectSlotAttributes OVar1;
  byte bVar2;
  code *pcVar3;
  RecyclableObject *this_00;
  uint uVar4;
  bool bVar5;
  PropertyIndex PVar6;
  PropertyIndex PVar7;
  BOOL BVar8;
  uint uVar9;
  int iVar10;
  undefined4 *puVar11;
  Var aValue;
  PathTypeHandlerWithAttr *pPVar12;
  PropertyRecord *pPVar13;
  PropertyValueInfo *pPVar14;
  RecyclableObject *local_50;
  RecyclableObject *func;
  PropertyValueInfo *local_40;
  uint local_38;
  ObjectSlotAttributes local_31 [8];
  PropertyAttributes attributes;
  
  func = &instance->super_RecyclableObject;
  local_40 = info;
  local_38 = propertyId;
  PVar6 = TypePath::LookupInline
                    ((this->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.typePath.ptr,
                     propertyId,
                     (uint)((this->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.
                            super_DynamicTypeHandler.unusedBytes >> 1));
  this_00 = func;
  if (PVar6 != 0xffff) {
    uVar9 = (uint)PVar6;
    OVar1 = (this->attributes).ptr[PVar6];
    if ((OVar1 & ObjectSlotAttr_Accessor) != ObjectSlotAttr_None) {
      aValue = DynamicObject::GetSlot((DynamicObject *)func,(uint)(this->setters).ptr[PVar6]);
      local_50 = VarTo<Js::RecyclableObject>(aValue);
      JavascriptOperators::CallSetter(local_50,this_00,value,(ScriptContext *)0x0);
      pPVar12 = (PathTypeHandlerWithAttr *)DynamicObject::GetTypeHandler((DynamicObject *)this_00);
      uVar4 = local_38;
      if (pPVar12 == this) {
        if (((this->attributes).ptr[PVar6] & ObjectSlotAttr_Deleted) != ObjectSlotAttr_None) {
          PVar6 = TypePath::LookupInline
                            ((this->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.typePath.
                             ptr,local_38,
                             (uint)((this->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.
                                    super_DynamicTypeHandler.unusedBytes >> 1));
          uVar9 = (uint)PVar6;
          if (((this->attributes).ptr[uVar9] & ObjectSlotAttr_Deleted) != ObjectSlotAttr_None) {
            return 1;
          }
        }
        pPVar14 = local_40;
        PVar7 = TypePath::LookupInline
                          ((this->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.typePath.
                           ptr,local_38,
                           (uint)((this->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.
                                  super_DynamicTypeHandler.unusedBytes >> 1));
        PVar6 = (PropertyIndex)uVar9;
        if (PVar6 != PVar7) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar11 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                      ,0xf2a,
                                      "(index == PathTypeHandlerBase::GetPropertyIndex(propertyId))"
                                      ,"index == PathTypeHandlerBase::GetPropertyIndex(propertyId)")
          ;
          if (!bVar5) goto LAB_00dd69e8;
          *puVar11 = 0;
        }
        local_31[0] = (this->attributes).ptr[uVar9];
        if ((local_31[0] & ObjectSlotAttr_Accessor) != ObjectSlotAttr_None) {
          if (pPVar14 == (PropertyValueInfo *)0x0) {
            return 1;
          }
          bVar2 = (this->setters).ptr[uVar9];
          pPVar14->m_instance = func;
          pPVar14->m_propertyIndex = (ushort)bVar2;
          pPVar14->m_attributes = local_31[0] & ObjectSlotAttr_PropertyAttributesMask;
          pPVar14->flags = InlineCacheSetterFlag;
          return 1;
        }
        if (pPVar14 == (PropertyValueInfo *)0x0) {
          return 1;
        }
        local_31[0] = local_31[0] & ObjectSlotAttr_PropertyAttributesMask;
        pPVar14->m_instance = func;
      }
      else {
        pPVar13 = ScriptContext::GetPropertyName
                            ((((((this_00->type).ptr)->javascriptLibrary).ptr)->
                             super_JavascriptLibraryBase).scriptContext.ptr,local_38);
        uVar9 = (*(pPVar12->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.
                  super_DynamicTypeHandler._vptr_DynamicTypeHandler[0xc])(pPVar12,pPVar13);
        PVar6 = (PropertyIndex)uVar9;
        if (PVar6 == 0xffff) {
          return 1;
        }
        iVar10 = (*(pPVar12->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.
                   super_DynamicTypeHandler._vptr_DynamicTypeHandler[0x3c])
                           (pPVar12,this_00,(ulong)uVar4,(ulong)(uVar9 & 0xffff),local_31);
        pPVar14 = local_40;
        if (iVar10 == 0) {
          return 1;
        }
        if ((local_31[0] & ObjectSlotAttr_Deleted) != ObjectSlotAttr_None) {
          return 1;
        }
        uVar9 = (*(pPVar12->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.
                  super_DynamicTypeHandler._vptr_DynamicTypeHandler[0x1a])
                          (pPVar12,this_00,(ulong)uVar4,&local_50,local_40,
                           (((((this_00->type).ptr)->javascriptLibrary).ptr)->
                           super_JavascriptLibraryBase).scriptContext.ptr);
        if (pPVar14 == (PropertyValueInfo *)0x0) {
          return 1;
        }
        if ((uVar9 & 2) == 0) {
          return 1;
        }
        pPVar14->m_instance = this_00;
      }
      pPVar14->m_propertyIndex = PVar6;
      pPVar14->m_attributes = local_31[0];
      pPVar14->flags = InlineCacheNoFlags;
      return 1;
    }
    if ((OVar1 & ObjectSlotAttr_Deleted) != ObjectSlotAttr_None) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0xf50,"(0)","Re-add of deleted property NYI in PathTypeHandler");
      if (!bVar5) {
LAB_00dd69e8:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar11 = 0;
    }
  }
  BVar8 = PathTypeHandlerBase::SetPropertyInternal<false>
                    ((PathTypeHandlerBase *)this,(DynamicObject *)func,local_38,PVar6,value,
                     ObjectSlotAttr_Default,local_40,flags,SideEffects_Any,false);
  return BVar8;
}

Assistant:

BOOL PathTypeHandlerWithAttr::SetProperty(DynamicObject* instance, PropertyId propertyId, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        PropertyIndex index = PathTypeHandlerBase::GetPropertyIndex(propertyId);
        if (index != Constants::NoSlot)
        {
            if (attributes[index] & ObjectSlotAttr_Accessor)
            {
                Assert(setters[index] != Constants::NoSlot);
                RecyclableObject* func = VarTo<RecyclableObject>(instance->GetSlot(setters[index]));
                JavascriptOperators::CallSetter(func, instance, value, NULL);

                // Wait for the setter to return before setting up the inline cache info, as the setter may change
                // the attributes
                DynamicTypeHandler *typeHandler = instance->GetTypeHandler();
                if (typeHandler == this)
                {
                    // Common path: setter didn't change the handler. Do the rest without virtual calls.
                    if (attributes[index] & ObjectSlotAttr_Deleted)
                    {
                        // Delete and re-add may have changed the index.
                        index = PathTypeHandlerBase::GetPropertyIndex(propertyId);
                        if (attributes[index] & ObjectSlotAttr_Deleted)
                        {
                            // Current state is really "deleted". Don't cache.
                            return TRUE;
                        }
                    }
                    Assert(index == PathTypeHandlerBase::GetPropertyIndex(propertyId));

                    if (attributes[index] & ObjectSlotAttr_Accessor)
                    {
                        PropertyValueInfo::Set(info, instance, setters[index], ObjectSlotAttributesToPropertyAttributes(attributes[index]), InlineCacheSetterFlag);
                    }
                    else
                    {
                        PropertyValueInfo::Set(info, instance, index, ObjectSlotAttributesToPropertyAttributes(attributes[index]), InlineCacheNoFlags);
                    }
                }
                else
                {
                    PropertyAttributes attributes;
                    index = typeHandler->GetPropertyIndex(instance->GetScriptContext()->GetPropertyName(propertyId));
                    if (index == Constants::NoSlot)
                    {
                        return TRUE;
                    }
                    if (typeHandler->GetAttributesWithPropertyIndex(instance, propertyId, index, &attributes) == FALSE)
                    {
                        return TRUE;
                    }
                    if (attributes & PropertyDeleted)
                    {
                        return TRUE;
                    }
                    DescriptorFlags descriptorFlags = typeHandler->GetSetter(instance, propertyId, (Var*)&func, info, instance->GetScriptContext());
                    if (descriptorFlags & Data)
                    {
                        PropertyValueInfo::Set(info, instance, index, attributes, InlineCacheNoFlags);
                    }
                }

                return TRUE;
            }
            else if (attributes[index] & ObjectSlotAttr_Deleted)
            {
                AssertMsg(0, "Re-add of deleted property NYI in PathTypeHandler");
            }
        }
        return SetPropertyInternal<false>(instance, propertyId, index, value, ObjectSlotAttr_Default, info, flags, SideEffects_Any);
    }